

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall re2::NFA::NFA(NFA *this,Prog *prog)

{
  Prog *pPVar1;
  __uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter> local_30;
  
  (this->q0_).size_ = 0;
  *(undefined8 *)
   &(this->q0_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> = 0;
  ((_Head_base<0UL,_int_*,_false> *)
  ((long)&(this->q0_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
          .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl =
       (int *)0x0;
  *(undefined8 *)
   &(this->q0_).dense_.ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
       = 0;
  ((_Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false> *)
  ((long)&(this->q0_).dense_.ptr_._M_t.
          super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
  + 8))->_M_head_impl = (IndexValue *)0x0;
  (this->q1_).size_ = 0;
  *(undefined8 *)
   &(this->q1_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> = 0;
  ((_Head_base<0UL,_int_*,_false> *)
  ((long)&(this->q1_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
          .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl =
       (int *)0x0;
  *(undefined8 *)
   &(this->q1_).dense_.ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
       = 0;
  ((_Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false> *)
  ((long)&(this->q1_).dense_.ptr_._M_t.
          super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
  + 8))->_M_head_impl = (IndexValue *)0x0;
  *(undefined8 *)
   &(this->stack_).ptr_._M_t.
    super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter> = 0;
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter>.
  super__Head_base<0UL,_re2::NFA::AddState_*,_false>._M_head_impl = (AddState *)0x0;
  this->prog_ = prog;
  this->start_ = prog->start_;
  this->ncapture_ = 0;
  this->longest_ = false;
  this->endmatch_ = false;
  this->btext_ = (char *)0x0;
  this->etext_ = (char *)0x0;
  SparseArray<re2::NFA::Thread_*>::resize(&this->q0_,prog->size_);
  SparseArray<re2::NFA::Thread_*>::resize(&this->q1_,this->prog_->size_);
  pPVar1 = this->prog_;
  PODArray<re2::NFA::AddState>::PODArray
            ((PODArray<re2::NFA::AddState> *)&local_30,
             pPVar1->inst_count_[6] + pPVar1->inst_count_[3] * 2 + pPVar1->inst_count_[4] + 1);
  std::__uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>::operator=
            ((__uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter> *)
             &this->stack_,&local_30);
  std::unique_ptr<re2::NFA::AddState[],_re2::PODArray<re2::NFA::AddState>::Deleter>::~unique_ptr
            ((unique_ptr<re2::NFA::AddState[],_re2::PODArray<re2::NFA::AddState>::Deleter> *)
             &local_30);
  this->free_threads_ = (Thread *)0x0;
  this->match_ = (char **)0x0;
  this->matched_ = false;
  return;
}

Assistant:

NFA::NFA(Prog* prog) {
  prog_ = prog;
  start_ = prog_->start();
  ncapture_ = 0;
  longest_ = false;
  endmatch_ = false;
  btext_ = NULL;
  etext_ = NULL;
  q0_.resize(prog_->size());
  q1_.resize(prog_->size());
  // See NFA::AddToThreadq() for why this is so.
  int nstack = 2*prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) + 1;  // + 1 for start inst
  stack_ = PODArray<AddState>(nstack);
  free_threads_ = NULL;
  match_ = NULL;
  matched_ = false;
}